

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O2

Surface * __thiscall SDL2pp::Surface::FillRects(Surface *this,Rect *rects,int count,Uint32 color)

{
  int iVar1;
  Exception *this_00;
  long lVar2;
  vector<SDL_Rect,_std::allocator<SDL_Rect>_> sdl_rects;
  
  sdl_rects.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sdl_rects.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sdl_rects.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<SDL_Rect,_std::allocator<SDL_Rect>_>::reserve(&sdl_rects,(long)count);
  for (lVar2 = (long)count << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    std::vector<SDL_Rect,std::allocator<SDL_Rect>>::emplace_back<SDL2pp::Rect_const&>
              ((vector<SDL_Rect,std::allocator<SDL_Rect>> *)&sdl_rects,rects);
    rects = rects + 1;
  }
  iVar1 = SDL_FillRects(this->surface_,
                        sdl_rects.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>._M_impl.
                        super__Vector_impl_data._M_start,count,color);
  if (iVar1 == 0) {
    std::_Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>::~_Vector_base
              (&sdl_rects.super__Vector_base<SDL_Rect,_std::allocator<SDL_Rect>_>);
    return this;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x50);
  Exception::Exception(this_00,"SDL_FillRects");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Surface& Surface::FillRects(const Rect* rects, int count, Uint32 color) {
	std::vector<SDL_Rect> sdl_rects;
	sdl_rects.reserve(static_cast<size_t>(count));
	for (const Rect* r = rects; r != rects + count; ++r)
		sdl_rects.emplace_back(*r);

	if (SDL_FillRects(surface_, sdl_rects.data(), count, color) != 0)
		throw Exception("SDL_FillRects");
	return *this;
}